

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

void __thiscall
t_haxe_generator::generate_service_helpers(t_haxe_generator *this,t_service *tservice)

{
  ostream *poVar1;
  pointer pptVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  vector<t_function_*,_std::allocator<t_function_*>_> local_30;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_service_,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_30,&tservice->functions_);
  pptVar2 = local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      generate_haxe_struct(this,(*pptVar2)->arglist_,false,false);
      generate_function_helpers(this,*pptVar2);
      pptVar2 = pptVar2 + 1;
    } while (pptVar2 !=
             local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_haxe_generator::generate_service_helpers(t_service* tservice) {
  f_service_ << endl << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_haxe_struct(ts, false);
    generate_function_helpers(*f_iter);
  }
}